

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_encoder.cc
# Opt level: O2

Status * __thiscall
draco::MeshSequentialEncoder::EncodeConnectivity
          (Status *__return_storage_ptr__,MeshSequentialEncoder *this)

{
  uint uVar1;
  Mesh *pMVar2;
  EncoderOptions *this_00;
  EncoderBuffer *this_01;
  pointer paVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  allocator<char> local_51;
  string local_50;
  
  pMVar2 = (this->super_MeshEncoder).mesh_;
  uVar5 = ((long)(pMVar2->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pMVar2->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  EncodeVarint<unsigned_int>((uint)uVar5,(this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  EncodeVarint<unsigned_int>
            ((((this->super_MeshEncoder).mesh_)->super_PointCloud).num_points_,
             (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  this_00 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"compress_connectivity",&local_51);
  bVar4 = Options::GetBool((Options *)this_00,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  this_01 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
  if (bVar4) {
    local_50._M_dataplus._M_p._0_2_ = (ushort)local_50._M_dataplus._M_p._1_1_ << 8;
    EncoderBuffer::Encode<unsigned_char>(this_01,(uchar *)&local_50);
    CompressAndEncodeIndices(this);
  }
  else {
    local_50._M_dataplus._M_p._0_2_ = CONCAT11(local_50._M_dataplus._M_p._1_1_,1);
    EncoderBuffer::Encode<unsigned_char>(this_01,(uchar *)&local_50);
    uVar1 = (((this->super_MeshEncoder).mesh_)->super_PointCloud).num_points_;
    if (uVar1 < 0x100) {
      for (lVar6 = 0; (uVar5 & 0xffffffff) * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
        paVar3 = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_50._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)&paVar3->_M_elems[0].value_ + lVar6)
        ;
        EncoderBuffer::Encode<unsigned_char>
                  ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,(uchar *)&local_50);
        local_50._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)(paVar3->_M_elems + 1) + lVar6);
        EncoderBuffer::Encode<unsigned_char>
                  ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,(uchar *)&local_50);
        local_50._M_dataplus._M_p._0_2_ =
             CONCAT11(local_50._M_dataplus._M_p._1_1_,
                      *(undefined1 *)((long)(paVar3->_M_elems + 2) + lVar6));
        EncoderBuffer::Encode<unsigned_char>
                  ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,(uchar *)&local_50);
      }
    }
    else if (uVar1 < 0x10000) {
      for (lVar6 = 0; (uVar5 & 0xffffffff) * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
        paVar3 = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_50._M_dataplus._M_p._0_2_ = *(undefined2 *)((long)&paVar3->_M_elems[0].value_ + lVar6)
        ;
        EncoderBuffer::Encode<unsigned_short>
                  ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,
                   (unsigned_short *)&local_50);
        local_50._M_dataplus._M_p._0_2_ = *(undefined2 *)((long)(paVar3->_M_elems + 1) + lVar6);
        EncoderBuffer::Encode<unsigned_short>
                  ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,
                   (unsigned_short *)&local_50);
        local_50._M_dataplus._M_p._0_2_ = *(undefined2 *)((long)(paVar3->_M_elems + 2) + lVar6);
        EncoderBuffer::Encode<unsigned_short>
                  ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,
                   (unsigned_short *)&local_50);
      }
    }
    else {
      lVar7 = (uVar5 & 0xffffffff) * 0xc;
      lVar6 = 0;
      if (uVar1 < 0x200000) {
        for (; lVar7 - lVar6 != 0; lVar6 = lVar6 + 0xc) {
          paVar3 = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          EncodeVarint<unsigned_int>
                    (*(uint *)((long)&paVar3->_M_elems[0].value_ + lVar6),
                     (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
          EncodeVarint<unsigned_int>
                    (*(uint *)((long)(paVar3->_M_elems + 1) + lVar6),
                     (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
          EncodeVarint<unsigned_int>
                    (*(uint *)((long)(paVar3->_M_elems + 2) + lVar6),
                     (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
        }
      }
      else {
        for (; lVar7 - lVar6 != 0; lVar6 = lVar6 + 0xc) {
          EncoderBuffer::
          Encode<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>
                    ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,
                     (array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                     ((long)&((((this->super_MeshEncoder).mesh_)->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].value_ + lVar6
                     ));
        }
      }
    }
  }
  __return_storage_ptr__->code_ = OK;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_string_length = 0;
  (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Status MeshSequentialEncoder::EncodeConnectivity() {
  // Serialize indices.
  const uint32_t num_faces = mesh()->num_faces();
  EncodeVarint(num_faces, buffer());
  EncodeVarint(static_cast<uint32_t>(mesh()->num_points()), buffer());

  // We encode all attributes in the original (possibly duplicated) format.
  if (options()->GetGlobalBool("compress_connectivity", false)) {
    // 0 = Encode compressed indices.
    buffer()->Encode(static_cast<uint8_t>(0));
    if (!CompressAndEncodeIndices()) {
      return Status(Status::DRACO_ERROR, "Failed to compress connectivity.");
    }
  } else {
    // 1 = Encode indices directly.
    buffer()->Encode(static_cast<uint8_t>(1));
    // Store vertex indices using a smallest data type that fits their range.
    if (mesh()->num_points() < 256) {
      // Serialize indices as uint8_t.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(static_cast<uint8_t>(face[0].value()));
        buffer()->Encode(static_cast<uint8_t>(face[1].value()));
        buffer()->Encode(static_cast<uint8_t>(face[2].value()));
      }
    } else if (mesh()->num_points() < (1 << 16)) {
      // Serialize indices as uint16_t.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(static_cast<uint16_t>(face[0].value()));
        buffer()->Encode(static_cast<uint16_t>(face[1].value()));
        buffer()->Encode(static_cast<uint16_t>(face[2].value()));
      }
    } else if (mesh()->num_points() < (1 << 21)) {
      // Serialize indices as varint.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        EncodeVarint(static_cast<uint32_t>(face[0].value()), buffer());
        EncodeVarint(static_cast<uint32_t>(face[1].value()), buffer());
        EncodeVarint(static_cast<uint32_t>(face[2].value()), buffer());
      }
    } else {
      // Serialize faces as uint32_t (default).
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(face);
      }
    }
  }
  return OkStatus();
}